

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_schnorrsig_verify
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_xonly_pubkey *pubkey)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_R8;
  int overflow;
  uchar buf [32];
  secp256k1_ge r;
  secp256k1_fe rx;
  secp256k1_gej pkj;
  secp256k1_ge pk;
  secp256k1_gej rj;
  secp256k1_scalar e;
  secp256k1_scalar s;
  secp256k1_scalar *in_stack_000005b8;
  secp256k1_scalar *in_stack_000005c0;
  secp256k1_gej *in_stack_000005c8;
  secp256k1_gej *in_stack_000005d0;
  secp256k1_ge *in_stack_fffffffffffffd88;
  undefined2 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd92;
  bool bVar2;
  undefined1 in_stack_fffffffffffffd93;
  undefined1 uVar3;
  int in_stack_fffffffffffffd94;
  secp256k1_scalar *in_stack_fffffffffffffd98;
  secp256k1_scalar *in_stack_fffffffffffffda0;
  secp256k1_fe *in_stack_fffffffffffffda8;
  secp256k1_fe *in_stack_fffffffffffffdb0;
  secp256k1_gej *in_stack_fffffffffffffdd8;
  secp256k1_ge *in_stack_fffffffffffffde0;
  uchar *in_stack_fffffffffffffe10;
  size_t in_stack_fffffffffffffe18;
  uchar *in_stack_fffffffffffffe20;
  uchar *in_stack_fffffffffffffe28;
  secp256k1_scalar *in_stack_fffffffffffffe30;
  secp256k1_fe local_148 [8];
  uint local_4;
  
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)
               CONCAT44(in_stack_fffffffffffffd94,
                        CONCAT13(in_stack_fffffffffffffd93,
                                 CONCAT12(in_stack_fffffffffffffd92,in_stack_fffffffffffffd90))),
               (char *)in_stack_fffffffffffffd88);
    local_4 = 0;
  }
  else {
    uVar3 = in_RDX != 0 || in_RCX == 0;
    if (in_RDX != 0 || in_RCX == 0) {
      if (in_R8 == 0) {
        secp256k1_callback_call
                  ((secp256k1_callback *)
                   CONCAT44(in_stack_fffffffffffffd94,
                            CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffd92,
                                                    in_stack_fffffffffffffd90))),
                   (char *)in_stack_fffffffffffffd88);
        local_4 = 0;
      }
      else {
        iVar1 = secp256k1_fe_impl_set_b32_limit
                          ((secp256k1_fe *)
                           CONCAT44(in_stack_fffffffffffffd94,
                                    CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffd92,
                                                            in_stack_fffffffffffffd90))),
                           (uchar *)in_stack_fffffffffffffd88);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          secp256k1_scalar_set_b32
                    (in_stack_fffffffffffffda0,(uchar *)in_stack_fffffffffffffd98,
                     (int *)CONCAT44(in_stack_fffffffffffffd94,
                                     CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffd92,
                                                             in_stack_fffffffffffffd90))));
          if (in_stack_fffffffffffffd94 == 0) {
            iVar1 = secp256k1_xonly_pubkey_load
                              ((secp256k1_context *)
                               (ulong)CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffd92,
                                                              in_stack_fffffffffffffd90)),
                               in_stack_fffffffffffffd88,(secp256k1_xonly_pubkey *)0x108490);
            if (iVar1 == 0) {
              local_4 = 0;
            }
            else {
              secp256k1_fe_impl_get_b32(&stack0xfffffffffffffd98,local_148);
              secp256k1_schnorrsig_challenge
                        (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                         in_stack_fffffffffffffe10);
              secp256k1_scalar_negate(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
              secp256k1_gej_set_ge
                        ((secp256k1_gej *)
                         CONCAT44(in_stack_fffffffffffffd94,
                                  CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffd92,
                                                          in_stack_fffffffffffffd90))),
                         in_stack_fffffffffffffd88);
              secp256k1_ecmult(in_stack_000005d0,in_stack_000005c8,in_stack_000005c0,
                               in_stack_000005b8);
              secp256k1_ge_set_gej_var(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
              iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x108547);
              if (iVar1 == 0) {
                secp256k1_fe_impl_normalize_var((secp256k1_fe *)&stack0xfffffffffffffde0);
                iVar1 = secp256k1_fe_impl_is_odd((secp256k1_fe *)&stack0xfffffffffffffde0);
                bVar2 = false;
                if (iVar1 == 0) {
                  iVar1 = secp256k1_fe_equal(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
                  bVar2 = iVar1 != 0;
                }
                local_4 = (uint)bVar2;
              }
              else {
                local_4 = 0;
              }
            }
          }
          else {
            local_4 = 0;
          }
        }
      }
    }
    else {
      secp256k1_callback_call
                ((secp256k1_callback *)
                 CONCAT44(in_stack_fffffffffffffd94,
                          CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffd92,
                                                  in_stack_fffffffffffffd90))),
                 (char *)in_stack_fffffffffffffd88);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_schnorrsig_verify(const secp256k1_context* ctx, const unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_xonly_pubkey *pubkey) {
    secp256k1_scalar s;
    secp256k1_scalar e;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_gej pkj;
    secp256k1_fe rx;
    secp256k1_ge r;
    unsigned char buf[32];
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_fe_set_b32_limit(&rx, &sig64[0])) {
        return 0;
    }

    secp256k1_scalar_set_b32(&s, &sig64[32], &overflow);
    if (overflow) {
        return 0;
    }

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }

    /* Compute e. */
    secp256k1_fe_get_b32(buf, &pk.x);
    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, buf);

    /* Compute rj =  s*G + (-e)*pkj */
    secp256k1_scalar_negate(&e, &e);
    secp256k1_gej_set_ge(&pkj, &pk);
    secp256k1_ecmult(&rj, &pkj, &e, &s);

    secp256k1_ge_set_gej_var(&r, &rj);
    if (secp256k1_ge_is_infinity(&r)) {
        return 0;
    }

    secp256k1_fe_normalize_var(&r.y);
    return !secp256k1_fe_is_odd(&r.y) &&
           secp256k1_fe_equal(&rx, &r.x);
}